

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

QString * QFSFileEngine::currentPath(QString *param_1)

{
  long lVar1;
  QFileSystemEntry *in_RDI;
  long in_FS_OFFSET;
  QFileSystemEntry *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFileSystemEngine::currentPath();
  QFileSystemEntry::filePath(in_RDI);
  QFileSystemEntry::~QFileSystemEntry(in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &in_RDI->m_filePath;
  }
  __stack_chk_fail();
}

Assistant:

QString QFSFileEngine::currentPath(const QString &)
{
    return QFileSystemEngine::currentPath().filePath();
}